

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O3

int ffgmf(fitsfile *gfptr,char *xtension,char *extname,int extver,int position,char *location,
         long *member,int *status)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  long firstrow;
  char nstr [1];
  int dummy;
  size_t local_2538;
  fitsfile *local_2530;
  char *local_2528;
  int local_2520;
  int mposition;
  char *tmpPtr [2];
  int grptype;
  int locationCol;
  int positionCol;
  int extverCol;
  int extnameCol;
  int xtensionCol;
  long mextver;
  long nmembers;
  long local_24d8;
  char *local_24d0;
  char *local_24c8;
  int uriCol;
  char grpLocation2 [1025];
  char tmpLocation [1025];
  char cwd [1025];
  char grpLocation1 [1025];
  char mbrLocation1 [1025];
  char mbrLocation2 [1025];
  char mbrLocation3 [1025];
  char charBuff2 [1025];
  char charBuff1 [1025];
  
  mposition = 0;
  nmembers = 0;
  mextver = 0;
  nstr[0] = '\0';
  iVar2 = *status;
  if (iVar2 == 0) {
    *member = 0;
    tmpPtr[0] = charBuff1;
    tmpPtr[1] = charBuff2;
    local_24c8 = xtension;
    if ((location == (char *)0x0) || (*location == '\0')) {
      tmpLocation[0] = '\0';
    }
    else {
      iVar2 = fits_is_url_absolute(location);
      if (iVar2 == 0) {
        fits_path2url(location,0x401,tmpLocation,status);
        if (tmpLocation[0] != '/') {
          fits_get_cwd(cwd,status);
          sVar3 = strlen(cwd);
          sVar4 = strlen(tmpLocation);
          if ((sVar4 + sVar3) - 0x400 < 0xfffffffffffffbff) {
            ffpmsg("cwd and location are too long (ffgmf)");
            *status = 0x7d;
            return 0x7d;
          }
          sVar3 = strlen(cwd);
          (cwd + sVar3)[0] = '/';
          (cwd + sVar3)[1] = '\0';
          strcat(cwd,tmpLocation);
          fits_clean_url(cwd,tmpLocation,status);
        }
      }
      else {
        strcpy(tmpLocation,location);
      }
    }
    local_24d0 = location;
    iVar2 = ffgtgc(gfptr,&xtensionCol,&extnameCol,&extverCol,&positionCol,&locationCol,&uriCol,
                   &grptype,status);
    *status = iVar2;
    local_2530 = gfptr;
    iVar2 = ffgtnm(gfptr,&nmembers,status);
    *status = iVar2;
    if (0 < nmembers) {
      local_24d8 = (long)extver;
      local_2520 = grptype;
      firstrow = 0;
      local_2528 = extname;
      do {
        if ((*member != 0) || (*status != 0)) goto LAB_001bc2b9;
        firstrow = firstrow + 1;
        if (xtensionCol == 0) {
LAB_001bbcf6:
          if (extnameCol != 0) {
            ffgcvs(local_2530,extnameCol,firstrow,1,1,nstr,tmpPtr,&dummy,status);
            iVar2 = fits_strcasecmp(tmpPtr[0],extname);
            if (iVar2 != 0) goto LAB_001bc287;
          }
          if (((extverCol == 0) ||
              (ffgcvj(local_2530,extverCol,firstrow,1,1,0,&mextver,&dummy,status),
              mextver == local_24d8)) &&
             ((positionCol == 0 ||
              (((local_2520 != 0xc && (local_2520 != 2)) ||
               (ffgcvk(local_2530,positionCol,firstrow,1,1,0,&mposition,&dummy,status),
               mposition == position)))))) {
            if (local_24d0 == (char *)0x0) {
              ffpmsg("NULL Location string given ==> ignore location (ffgmf)");
LAB_001bc27c:
              *member = firstrow;
            }
            else {
              if (locationCol == 0) {
                mbrLocation1[0] = '\0';
LAB_001bbfbd:
                iVar2 = fits_get_url(local_2530,mbrLocation1,mbrLocation2,(char *)0x0,(char *)0x0,
                                     (int *)0x0,status);
                cVar1 = mbrLocation1[0];
                *status = iVar2;
                if (((mbrLocation1[0] == '\0') ||
                    (iVar2 = fits_is_url_absolute(mbrLocation1), cVar1 == '/')) || (iVar2 != 0)) {
LAB_001bc080:
                  cVar1 = mbrLocation2[0];
                  if (((mbrLocation2[0] != '\0') &&
                      (iVar2 = fits_is_url_absolute(mbrLocation2), cVar1 != '/')) && (iVar2 == 0)) {
                    fits_get_cwd(cwd,status);
                    local_2538 = strlen(cwd);
                    sVar3 = strlen(mbrLocation2);
                    if ((sVar3 + local_2538) - 0x400 < 0xfffffffffffffbff) goto LAB_001bc0e7;
                    sVar3 = strlen(cwd);
                    (cwd + sVar3)[0] = '/';
                    (cwd + sVar3)[1] = '\0';
                    strcat(cwd,mbrLocation2);
                    fits_clean_url(cwd,mbrLocation2,status);
                  }
LAB_001bc24f:
                  iVar2 = strcmp(mbrLocation1,tmpLocation);
                  extname = local_2528;
                  if ((iVar2 != 0) && (iVar2 = strcmp(mbrLocation2,tmpLocation), iVar2 != 0))
                  goto LAB_001bc287;
                  goto LAB_001bc27c;
                }
                fits_get_cwd(cwd,status);
                local_2538 = strlen(cwd);
                sVar3 = strlen(mbrLocation1);
                if (0xfffffffffffffbfe < (sVar3 + local_2538) - 0x400) {
                  sVar3 = strlen(cwd);
                  (cwd + sVar3)[0] = '/';
                  (cwd + sVar3)[1] = '\0';
                  strcat(cwd,mbrLocation1);
                  fits_clean_url(cwd,mbrLocation1,status);
                  goto LAB_001bc080;
                }
LAB_001bc0e7:
                ffpmsg("cwd and member locations are too long (ffgmf)");
              }
              else {
                ffgcvs(local_2530,locationCol,firstrow,1,1,nstr,tmpPtr,&dummy,status);
                strcpy(mbrLocation1,tmpPtr[0]);
                cVar1 = mbrLocation1[0];
                mbrLocation2[0] = '\0';
                if (mbrLocation1[0] == '\0') goto LAB_001bbfbd;
                iVar2 = fits_is_url_absolute(mbrLocation1);
                if ((cVar1 == '/') || (iVar2 != 0)) goto LAB_001bc24f;
                strcpy(mbrLocation2,mbrLocation1);
                iVar2 = fits_get_url(local_2530,grpLocation1,grpLocation2,(char *)0x0,(char *)0x0,
                                     (int *)0x0,status);
                cVar1 = grpLocation1[0];
                *status = iVar2;
                if (grpLocation1[0] == '\0') {
LAB_001bc13f:
                  mbrLocation1[0] = '\0';
LAB_001bc14f:
                  cVar1 = grpLocation2[0];
                  if (grpLocation2[0] != '\0') {
                    iVar2 = fits_is_url_absolute(grpLocation2);
                    if ((cVar1 != '/') && (iVar2 == 0)) {
                      fits_get_cwd(cwd,status);
                      local_2538 = strlen(cwd);
                      sVar3 = strlen(grpLocation2);
                      if ((sVar3 + local_2538) - 0x400 < 0xfffffffffffffbff) goto LAB_001bc1b5;
                      sVar3 = strlen(cwd);
                      (cwd + sVar3)[0] = '/';
                      (cwd + sVar3)[1] = '\0';
                      strcat(cwd,grpLocation2);
                      fits_clean_url(cwd,grpLocation2,status);
                    }
                    fits_relurl2url(grpLocation2,mbrLocation2,mbrLocation3,status);
                    if (*status != 0x7d) {
                      if (*status == 0) {
                        strcpy(mbrLocation2,mbrLocation3);
                      }
                      goto LAB_001bc24f;
                    }
                    *status = 0;
                  }
                  mbrLocation2[0] = '\0';
                  goto LAB_001bc24f;
                }
                iVar2 = fits_is_url_absolute(grpLocation1);
                if ((cVar1 == '/') || (iVar2 != 0)) {
LAB_001bbf55:
                  fits_relurl2url(grpLocation1,mbrLocation1,mbrLocation3,status);
                  if (*status == 0x7d) {
                    *status = 0;
                    goto LAB_001bc13f;
                  }
                  if (*status == 0) {
                    strcpy(mbrLocation1,mbrLocation3);
                  }
                  goto LAB_001bc14f;
                }
                fits_get_cwd(cwd,status);
                local_2538 = strlen(cwd);
                sVar3 = strlen(grpLocation1);
                if (0xfffffffffffffbfe < (sVar3 + local_2538) - 0x400) {
                  sVar3 = strlen(cwd);
                  (cwd + sVar3)[0] = '/';
                  (cwd + sVar3)[1] = '\0';
                  strcat(cwd,grpLocation1);
                  fits_clean_url(cwd,grpLocation1,status);
                  goto LAB_001bbf55;
                }
LAB_001bc1b5:
                ffpmsg("cwd and group locations are too long (ffgmf)");
              }
              *status = 0x7d;
              extname = local_2528;
            }
          }
        }
        else {
          ffgcvs(local_2530,xtensionCol,firstrow,1,1,nstr,tmpPtr,&dummy,status);
          iVar2 = fits_strcasecmp(tmpPtr[0],local_24c8);
          if (iVar2 == 0) goto LAB_001bbcf6;
        }
LAB_001bc287:
      } while (firstrow < nmembers);
    }
    if ((*member == 0) && (*status == 0)) {
      *status = 0x156;
      ffpmsg("Cannot find specified member HDU (ffgmf)");
    }
LAB_001bc2b9:
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffgmf(fitsfile *gfptr, /* pointer to grouping table HDU to search       */
	   char *xtension,  /* XTENSION value for member HDU                */
	   char *extname,   /* EXTNAME value for member HDU                 */
	   int   extver,    /* EXTVER value for member HDU                  */
	   int   position,  /* HDU position value for member HDU            */
	   char *location,  /* FITS file location value for member HDU      */
	   long *member,    /* member HDU ID within group table (if found)  */
	   int  *status)    /* return status code                           */

/*
   try to find the entry for the member HDU defined by the xtension, extname,
   extver, position, and location parameters within the grouping table
   pointed to by gfptr. If the member HDU is found then its ID (row number)
   within the grouping table is returned in the member variable; if not
   found then member is returned with a value of 0 and the status return
   code will be set to MEMBER_NOT_FOUND.

   Note that the member HDU postion information is used to obtain a member
   match only if the grouping table type is GT_ID_POS_URI or GT_ID_POS. This
   is because the position information can become invalid much more
   easily then the reference information for a group member.
*/

{
  int xtensionCol,extnameCol,extverCol,positionCol,locationCol,uriCol;
  int mposition = 0;
  int grptype;
  int dummy;
  int i;

  long nmembers = 0;
  long mextver  = 0;
 
  char  charBuff1[FLEN_FILENAME];
  char  charBuff2[FLEN_FILENAME];
  char  tmpLocation[FLEN_FILENAME];
  char  mbrLocation1[FLEN_FILENAME];
  char  mbrLocation2[FLEN_FILENAME];
  char  mbrLocation3[FLEN_FILENAME];
  char  grpLocation1[FLEN_FILENAME];
  char  grpLocation2[FLEN_FILENAME];
  char  cwd[FLEN_FILENAME];

  char  nstr[] = {'\0'};
  char *tmpPtr[2];

  if(*status != 0) return(*status);

  *member = 0;

  tmpPtr[0] = charBuff1;
  tmpPtr[1] = charBuff2;


  if(*status != 0) return(*status);

  /*
    if the passed LOCATION value is not an absolute URL then turn it
    into an absolute path
  */

  if(location == NULL)
    {
      *tmpLocation = 0;
    }

  else if(*location == 0)
    {
      *tmpLocation = 0;
    }

  else if(!fits_is_url_absolute(location))
    {
      fits_path2url(location,FLEN_FILENAME,tmpLocation,status);

      if(*tmpLocation != '/')
	{
	  fits_get_cwd(cwd,status);
          if (strlen(cwd)+strlen(tmpLocation)+1 > 
                    FLEN_FILENAME-1)
          {
             ffpmsg("cwd and location are too long (ffgmf)");
             return (*status = URL_PARSE_ERROR);
          }
	  strcat(cwd,"/");
	  strcat(cwd,tmpLocation);
	  fits_clean_url(cwd,tmpLocation,status);
	}
    }

  else
    strcpy(tmpLocation,location);

  /*
     retrieve the Grouping Convention reserved column positions within
     the grouping table
  */

  *status = ffgtgc(gfptr,&xtensionCol,&extnameCol,&extverCol,&positionCol,
		   &locationCol,&uriCol,&grptype,status);

  /* retrieve the number of group members */

  *status = fits_get_num_members(gfptr,&nmembers,status);
	      
  /* 
     loop over all grouping table rows until the member HDU is found 
  */

  for(i = 1; i <= nmembers && *member == 0 && *status == 0; ++i)
    {
      if(xtensionCol != 0)
	{
	  fits_read_col_str(gfptr,xtensionCol,i,1,1,nstr,tmpPtr,&dummy,status);
	  if(fits_strcasecmp(tmpPtr[0],xtension) != 0) continue;
	}
	  
      if(extnameCol  != 0)
	{
	  fits_read_col_str(gfptr,extnameCol,i,1,1,nstr,tmpPtr,&dummy,status);
	  if(fits_strcasecmp(tmpPtr[0],extname) != 0) continue;
	}
	  
      if(extverCol   != 0)
	{
	  fits_read_col_lng(gfptr,extverCol,i,1,1,0,
			    (long*)&mextver,&dummy,status);
	  if(extver != mextver) continue;
	}
      
      /* note we only use postionCol if we have to */

      if(positionCol != 0 && 
	            (grptype == GT_ID_POS || grptype == GT_ID_POS_URI))
	{
	  fits_read_col_int(gfptr,positionCol,i,1,1,0,
			    &mposition,&dummy,status);
	  if(position != mposition) continue;
	}
      
      /*
	if no location string was passed to the function then assume that
	the calling application does not wish to use it as a comparision
	critera ==> if we got this far then we have a match
      */

      if(location == NULL)
	{
	  ffpmsg("NULL Location string given ==> ignore location (ffgmf)");
	  *member = i;
	  continue;
	}

      /*
	if the grouping table MEMBER_LOCATION column exists then read the
	location URL for the member, else set the location string to
	a zero-length string for subsequent comparisions
      */

      if(locationCol != 0)
	{
	  fits_read_col_str(gfptr,locationCol,i,1,1,nstr,tmpPtr,&dummy,status);
	  strcpy(mbrLocation1,tmpPtr[0]);
	  *mbrLocation2 = 0;
	}
      else
	*mbrLocation1 = 0;

      /* 
	 if the member location string from the grouping table is zero 
	 length (either implicitly or explicitly) then assume that the 
	 member HDU is in the same file as the grouping table HDU; retrieve
	 the possible URL values of the grouping table HDU file 
       */

      if(*mbrLocation1 == 0)
	{
	  /* retrieve the possible URLs of the grouping table file */
	  *status = fits_get_url(gfptr,mbrLocation1,mbrLocation2,NULL,NULL,
				 NULL,status);

	  /* if non-NULL, make sure the first URL is absolute or a full path */
	  if(*mbrLocation1 != 0 && !fits_is_url_absolute(mbrLocation1) &&
	     *mbrLocation1 != '/')
	    {
	      fits_get_cwd(cwd,status);
              if (strlen(cwd)+strlen(mbrLocation1)+1 > 
                        FLEN_FILENAME-1)
              {
                 ffpmsg("cwd and member locations are too long (ffgmf)");
                 *status = URL_PARSE_ERROR;
                 continue;
              }
	      strcat(cwd,"/");
	      strcat(cwd,mbrLocation1);
	      fits_clean_url(cwd,mbrLocation1,status);
	    }

	  /* if non-NULL, make sure the first URL is absolute or a full path */
	  if(*mbrLocation2 != 0 && !fits_is_url_absolute(mbrLocation2) &&
	     *mbrLocation2 != '/')
	    {
	      fits_get_cwd(cwd,status);
              if (strlen(cwd)+strlen(mbrLocation2)+1 > 
                        FLEN_FILENAME-1)
              {
                 ffpmsg("cwd and member locations are too long (ffgmf)");
                 *status = URL_PARSE_ERROR;
                 continue;
              }
	      strcat(cwd,"/");
	      strcat(cwd,mbrLocation2);
	      fits_clean_url(cwd,mbrLocation2,status);
	    }
	}

      /*
	if the member location was specified, then make sure that it is
	either an absolute URL or specifies a full path
      */

      else if(!fits_is_url_absolute(mbrLocation1) && *mbrLocation1 != '/')
	{
	  strcpy(mbrLocation2,mbrLocation1);

	  /* get the possible URLs for the grouping table file */
	  *status = fits_get_url(gfptr,grpLocation1,grpLocation2,NULL,NULL,
				 NULL,status);
	  
	  if(*grpLocation1 != 0)
	    {
	      /* make sure the first grouping table URL is absolute */
	      if(!fits_is_url_absolute(grpLocation1) && *grpLocation1 != '/')
		{
		  fits_get_cwd(cwd,status);
                  if (strlen(cwd)+strlen(grpLocation1)+1 > 
                            FLEN_FILENAME-1)
                  {
                     ffpmsg("cwd and group locations are too long (ffgmf)");
                     *status = URL_PARSE_ERROR;
                     continue;
                  }
		  strcat(cwd,"/");
		  strcat(cwd,grpLocation1);
		  fits_clean_url(cwd,grpLocation1,status);
		}
	      
	      /* create an absoute URL for the member */

	      fits_relurl2url(grpLocation1,mbrLocation1,mbrLocation3,status);
	      
	      /* 
		 if URL construction succeeded then copy it to the
		 first location string; else set the location string to 
		 empty
	      */

	      if(*status == 0)
		{
		  strcpy(mbrLocation1,mbrLocation3);
		}

	      else if(*status == URL_PARSE_ERROR)
		{
		  *status       = 0;
		  *mbrLocation1 = 0;
		}
	    }
	  else
	    *mbrLocation1 = 0;

	  if(*grpLocation2 != 0)
	    {
	      /* make sure the second grouping table URL is absolute */
	      if(!fits_is_url_absolute(grpLocation2) && *grpLocation2 != '/')
		{
		  fits_get_cwd(cwd,status);
                  if (strlen(cwd)+strlen(grpLocation2)+1 > 
                            FLEN_FILENAME-1)
                  {
                     ffpmsg("cwd and group locations are too long (ffgmf)");
                     *status = URL_PARSE_ERROR;
                     continue;
                  }
		  strcat(cwd,"/");
		  strcat(cwd,grpLocation2);
		  fits_clean_url(cwd,grpLocation2,status);
		}
	      
	      /* create an absolute URL for the member */

	      fits_relurl2url(grpLocation2,mbrLocation2,mbrLocation3,status);
	      
	      /* 
		 if URL construction succeeded then copy it to the
		 second location string; else set the location string to 
		 empty
	      */

	      if(*status == 0)
		{
		  strcpy(mbrLocation2,mbrLocation3);
		}

	      else if(*status == URL_PARSE_ERROR)
		{
		  *status       = 0;
		  *mbrLocation2 = 0;
		}
	    }
	  else
	    *mbrLocation2 = 0;
	}

      /*
	compare the passed member HDU file location string with the
	(possibly two) member location strings to see if there is a match
       */

      if(strcmp(mbrLocation1,tmpLocation) != 0 && 
	 strcmp(mbrLocation2,tmpLocation) != 0   ) continue;
  
      /* if we made it this far then a match to the member HDU was found */
      
      *member = i;
    }

  /* if a match was not found then set the return status code */

  if(*member == 0 && *status == 0) 
    {
      *status = MEMBER_NOT_FOUND;
      ffpmsg("Cannot find specified member HDU (ffgmf)");
    }

  return(*status);
}